

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LoopGenerateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopGenerateSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::MemberSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5,
          ExpressionSyntax *args_6,Token *args_7,ExpressionSyntax *args_8,Token *args_9,
          ExpressionSyntax *args_10,Token *args_11,MemberSyntax *args_12)

{
  Token openParen;
  Token keyword;
  Token genvar;
  Token semi1;
  Token closeParen;
  LoopGenerateSyntax *pLVar1;
  undefined8 *in_RCX;
  undefined8 *in_R8;
  Token *in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000018;
  Token *in_stack_00000028;
  undefined8 in_stack_00000030;
  Token *in_stack_00000038;
  Info *in_stack_00000040;
  size_t in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  BumpAllocator *in_stack_fffffffffffffea8;
  
  pLVar1 = (LoopGenerateSyntax *)
           allocate(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  keyword.info = in_stack_00000040;
  keyword._0_8_ = in_stack_00000038->info;
  openParen.info = *(Info **)in_stack_00000038;
  openParen._0_8_ = in_stack_00000030;
  genvar.info = (Info *)pLVar1;
  genvar._0_8_ = in_stack_00000040;
  semi1.info = (Info *)*in_stack_00000008;
  semi1._0_8_ = in_stack_00000018[1];
  closeParen.info = (Info *)*in_RCX;
  closeParen._0_8_ = in_R8[1];
  slang::syntax::LoopGenerateSyntax::LoopGenerateSyntax
            ((LoopGenerateSyntax *)in_stack_00000028->info,
             *(SyntaxList<slang::syntax::AttributeInstanceSyntax> **)in_stack_00000028,keyword,
             openParen,genvar,*in_stack_00000038,*in_stack_00000028,
             (ExpressionSyntax *)*in_stack_00000018,semi1,(ExpressionSyntax *)in_stack_00000008[1],
             *in_R9,(ExpressionSyntax *)*in_R8,closeParen,(MemberSyntax *)in_RCX[1]);
  return pLVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }